

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O1

void __thiscall Js::FunctionProxy::Copy(FunctionProxy *this,FunctionProxy *other)

{
  ScriptFunctionType *pSVar1;
  code *pcVar2;
  bool bVar3;
  byte bVar4;
  undefined4 *puVar5;
  void *ptr;
  
  if (other == (FunctionProxy *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x5d2,"(other)","other");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  bVar4 = other->field_0x44 & 0xfd | this->field_0x44 & 2;
  other->field_0x44 = bVar4;
  if ((this->field_0x44 & 4) != 0) {
    other->field_0x44 = bVar4 | 4;
  }
  if ((this->field_0x44 & 8) != 0) {
    other->field_0x44 = other->field_0x44 | 8;
  }
  pSVar1 = (this->deferredPrototypeType).ptr;
  Memory::Recycler::WBSetBit((char *)&other->deferredPrototypeType);
  (other->deferredPrototypeType).ptr = pSVar1;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&other->deferredPrototypeType);
  pSVar1 = (this->undeferredFunctionType).ptr;
  Memory::Recycler::WBSetBit((char *)&other->undeferredFunctionType);
  (other->undeferredFunctionType).ptr = pSVar1;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&other->undeferredFunctionType);
  ptr = GetAuxPtr(this,FunctionObjectTypeList);
  SetAuxPtr(other,FunctionObjectTypeList,ptr);
  return;
}

Assistant:

void FunctionProxy::Copy(FunctionProxy* other)
    {
        Assert(other);

        other->SetIsTopLevel(this->m_isTopLevel);

        if (this->IsPublicLibraryCode())
        {
            other->SetIsPublicLibraryCode();
        }

        if (this->IsJsBuiltInCode())
        {
            other->SetIsJsBuiltInCode();
        }

#define CopyDeferParseField(field) other->field = this->field;
        CopyDeferParseField(deferredPrototypeType);
        CopyDeferParseField(undeferredFunctionType);
#undef CopyDeferParseField

        other->SetFunctionObjectTypeList(this->GetFunctionObjectTypeList());
    }